

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

void __thiscall helics::CoreBroker::fedRegistration(CoreBroker *this,ActionMessage *command)

{
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
  *this_00;
  ushort uVar1;
  GlobalFederateId federateID;
  pointer pBVar2;
  BaseTimeCoordinator *pBVar3;
  pointer pcVar4;
  size_type sVar5;
  string_view message;
  byte *__src;
  bool bVar6;
  route_id rVar7;
  iterator iVar8;
  pointer pBVar9;
  BasicFedInfo *fed;
  int iVar10;
  int32_t iVar11;
  size_t sVar12;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  pair<std::__detail::_Node_iterator<std::pair<const_helics::GlobalFederateId,_unsigned_long>,_false,_false>,_bool>
  pVar13;
  pair<std::__detail::_Node_iterator<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false,_false>,_bool>
  pVar14;
  string_view name;
  string_view fmt;
  format_args args;
  GlobalFederateId global_fedid;
  route_id route_id;
  string_view fedName;
  ActionMessage noInit;
  ActionMessage fedEnableProfiling;
  GlobalFederateId local_1e8;
  uint local_1e4;
  size_t local_1e0;
  byte *pbStack_1d8;
  string local_1d0;
  size_t local_1b0;
  char *pcStack_1a8;
  undefined1 local_1a0 [16];
  GlobalFederateId local_190;
  ushort local_186;
  SmallBuffer local_160;
  ActionMessage local_e8;
  
  if ((this->super_BrokerBase).field_0x295 == '\0') {
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
    emplace_back<helics::ActionMessage>(&this->earlyMessages,command);
    return;
  }
  if ((short)command->flags < 0) {
    if ((this->super_BrokerBase).brokerState._M_i < OPERATING) goto LAB_003407d6;
LAB_003407a3:
    if ((this->super_BrokerBase).brokerState._M_i != OPERATING) {
      iVar11 = 0xe;
LAB_00340aec:
      sendFedErrorAck(this,command,iVar11);
      return;
    }
    if ((command->flags & 0x100) == 0 &&
        (-1 < (short)command->flags && (this->super_BrokerBase).dynamicFederation == false)) {
      iVar11 = 5;
      goto LAB_00340aec;
    }
    local_1e0 = (command->payload).bufferSize;
    pbStack_1d8 = (command->payload).heap;
    bVar6 = true;
    if ((command->flags >> 10 & 1) == 0) goto LAB_003407f0;
    this_00 = &(this->mFederates).lookup1;
    local_1a0._0_8_ = local_1e0;
    local_1a0._8_8_ = pbStack_1d8;
    iVar8 = std::
            _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)this_00,(key_type *)local_1a0);
    if ((iVar8.
         super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
         ._M_cur == (__node_type *)0x0) ||
       (pBVar9 = (this->mFederates).dataStorage.
                 super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start +
                 *(long *)((long)iVar8.
                                 super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                                 ._M_cur + 0x18),
       pBVar9 == (this->mFederates).dataStorage.
                 super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish)) goto LAB_003407f0;
    if (pBVar9->reentrant != false) {
      rVar7 = getRoute(this,(GlobalFederateId)(command->source_id).gid);
      (pBVar9->route).rid = rVar7.rid;
      (pBVar9->parent).gid = (command->source_id).gid;
      pBVar9->state = CONNECTED;
      if ((this->super_BrokerBase).field_0x294 == '\0') goto LAB_00340b02;
      local_1a0._0_8_ = local_1e0;
      local_1a0._8_8_ = pbStack_1d8;
      iVar8 = std::
              _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)this_00,(key_type *)local_1a0);
      if (iVar8.
          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
          ._M_cur == (__node_type *)0x0) {
        pBVar9 = (this->mFederates).dataStorage.
                 super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        pBVar9 = (this->mFederates).dataStorage.
                 super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start +
                 *(long *)((long)iVar8.
                                 super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                                 ._M_cur + 0x18);
      }
      local_1e4 = (pBVar9->route).rid;
      local_1a0._0_8_ = local_1e0;
      local_1a0._8_8_ = pbStack_1d8;
      iVar8 = std::
              _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)this_00,(key_type *)local_1a0);
      if (iVar8.
          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
          ._M_cur == (__node_type *)0x0) {
        pBVar9 = (this->mFederates).dataStorage.
                 super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        pBVar9 = (this->mFederates).dataStorage.
                 super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start +
                 *(long *)((long)iVar8.
                                 super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                                 ._M_cur + 0x18);
      }
      bVar6 = false;
      goto LAB_00340a4f;
    }
  }
  else {
    iVar10 = 0;
    for (pBVar9 = (this->mFederates).dataStorage.
                  super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pBVar9 != (this->mFederates).dataStorage.
                  super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pBVar9 = pBVar9 + 1) {
      iVar10 = iVar10 + (pBVar9->nonCounting ^ 1);
    }
    if ((this->super_BrokerBase).maxFederateCount <= iVar10) {
      iVar11 = 0xb;
      goto LAB_00340aec;
    }
    if (INITIALIZING < (this->super_BrokerBase).brokerState._M_i) goto LAB_003407a3;
    bVar6 = allInitReady(this);
    if (bVar6) {
      ActionMessage::ActionMessage((ActionMessage *)local_1a0,cmd_init_not_ready);
      local_1a0._8_4_ = (this->super_BrokerBase).global_broker_id_local.gid;
      (*(this->super_Broker)._vptr_Broker[0x22])(this,0,(ActionMessage *)local_1a0);
      ActionMessage::~ActionMessage((ActionMessage *)local_1a0);
    }
LAB_003407d6:
    local_1e0 = (command->payload).bufferSize;
    pbStack_1d8 = (command->payload).heap;
    bVar6 = false;
LAB_003407f0:
    local_1a0._0_8_ = local_1e0;
    local_1a0._8_8_ = pbStack_1d8;
    iVar8 = std::
            _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&(this->mFederates).lookup1,(key_type *)local_1a0);
    if ((iVar8.
         super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
         ._M_cur == (__node_type *)0x0) ||
       ((this->mFederates).dataStorage.
        super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl.
        super__Vector_impl_data._M_start +
        *(long *)((long)iVar8.
                        super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                        ._M_cur + 0x18) ==
        (this->mFederates).dataStorage.
        super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      gmlc::containers::
      DualStringMappedVector<helics::BasicFedInfo,helics::GlobalFederateId,(reference_stability)1,5>
      ::insert<std::basic_string_view<char,std::char_traits<char>>&>
                ((DualStringMappedVector<helics::BasicFedInfo,helics::GlobalFederateId,(reference_stability)1,5>
                  *)&this->mFederates,local_1e0,pbStack_1d8);
      rVar7 = getRoute(this,(GlobalFederateId)(command->source_id).gid);
      pBVar9 = (this->mFederates).dataStorage.
               super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pBVar9[-1].route.rid = rVar7.rid;
      pBVar9[-1].parent.gid = (command->source_id).gid;
      uVar1 = command->flags;
      if ((short)uVar1 < 0) {
        pBVar9[-1].nonCounting = true;
      }
      if ((uVar1 >> 8 & 1) != 0) {
        pBVar9[-1].observer = true;
      }
      if ((uVar1 >> 10 & 1) != 0) {
        pBVar9[-1].reentrant = true;
      }
      pBVar9[-1].dynamic = bVar6;
      pBVar2 = (this->mFederates).dataStorage.
               super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      sVar12 = ((long)pBVar9 - (long)pBVar2 >> 3) * 0x6db6db6db6db6db7 - 1;
      if ((uVar1 >> 0xe & 1) == 0) {
        if ((this->super_BrokerBase).field_0x294 == '\x01') {
          iVar10 = 0;
          if ((ushort)(command->counter - 1) < 0x10) {
            iVar10 = (uint)command->counter * 100000000;
          }
          pBVar9[-1].global_id.gid = (int)sVar12 + iVar10 + 0x20000;
          local_1a0._0_8_ = sVar12;
          if (pBVar9 != pBVar2) {
            std::
            _Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,unsigned_long>,std::allocator<std::pair<helics::GlobalFederateId_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<helics::GlobalFederateId_const&,unsigned_long&>
                      ((_Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,unsigned_long>,std::allocator<std::pair<helics::GlobalFederateId_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&(this->mFederates).lookup2,&pBVar9[-1].global_id,local_1a0);
          }
        }
      }
      else {
        pBVar9[-1].global_id.gid = (command->dest_handle).hid;
        local_1a0._0_8_ = sVar12;
        if ((pBVar9 == pBVar2) ||
           (pVar13 = std::
                     _Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,unsigned_long>,std::allocator<std::pair<helics::GlobalFederateId_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                     ::_M_emplace<helics::GlobalFederateId_const&,unsigned_long&>
                               ((_Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,unsigned_long>,std::allocator<std::pair<helics::GlobalFederateId_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                 *)&(this->mFederates).lookup2,&pBVar9[-1].global_id,local_1a0),
           ((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0)) {
          iVar11 = 0x11;
          goto LAB_00340b39;
        }
      }
      if ((this->super_BrokerBase).field_0x294 == '\0') {
LAB_00340b02:
        iVar10 = (this->super_BrokerBase).global_broker_id_local.gid;
        if ((iVar10 != -2010000000) && (iVar10 != -1700000000)) {
          (command->source_id).gid = iVar10;
          (*(this->super_Broker)._vptr_Broker[0x22])(this,0,command);
          return;
        }
        gmlc::containers::SimpleQueue<helics::ActionMessage,std::mutex>::
        push<helics::ActionMessage&>
                  ((SimpleQueue<helics::ActionMessage,std::mutex> *)&this->delayTransmitQueue,
                   command);
        return;
      }
      pBVar9 = (this->mFederates).dataStorage.
               super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      local_1e4 = pBVar9[-1].route.rid;
      pBVar9 = pBVar9 + -1;
      bVar6 = true;
LAB_00340a4f:
      local_1e8.gid = (pBVar9->global_id).gid;
      pVar14 = std::
               _Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,helics::route_id>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               ::_M_emplace<helics::GlobalFederateId&,helics::route_id&>
                         ((_Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,helics::route_id>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                           *)&this->routing_table,&local_1e8,&local_1e4);
      if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0 && !bVar6) {
        *(uint *)((long)pVar14.first.
                        super__Node_iterator_base<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false>
                        ._M_cur.
                        super__Node_iterator_base<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false>
                 + 0xc) = local_1e4;
      }
      ActionMessage::ActionMessage((ActionMessage *)local_1a0,cmd_fed_ack);
      __src = pbStack_1d8;
      local_160.bufferSize = local_1e0;
      local_1a0._8_4_ = (this->super_BrokerBase).global_broker_id_local.gid;
      local_190.gid = local_1e8.gid;
      if (local_160.heap == pbStack_1d8) {
      }
      else {
        SmallBuffer::reserve(&local_160,local_1e0);
        if (local_160.bufferSize != 0) {
          memcpy(local_160.heap,__src,local_160.bufferSize);
        }
      }
      if ((command->flags >> 0xe & 1) != 0) {
        local_186 = local_186 | 0x4000;
      }
      bVar6 = (this->super_BrokerBase).asyncTime;
      if ((((this->super_BrokerBase).globalTime != false) || ((bVar6 & 1U) != 0)) &&
         (local_186 = (bVar6 & 1) << 7 | local_186 | 0x20, -1 < (short)command->flags)) {
        pBVar3 = (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
        (*pBVar3->_vptr_BaseTimeCoordinator[4])(pBVar3,(ulong)(uint)local_1e8.gid);
        pBVar3 = (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
        (*pBVar3->_vptr_BaseTimeCoordinator[5])(pBVar3,(ulong)(uint)local_1e8.gid);
        BaseTimeCoordinator::setAsChild
                  ((this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl,
                   local_1e8);
      }
      if ((this->super_BrokerBase).globalDisconnect == true) {
        local_186 = local_186 | 0x800;
      }
      (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)local_1e4,local_1a0);
      if (8 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
        federateID.gid = (this->super_BrokerBase).global_broker_id_local.gid;
        pcVar4 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        sVar5 = (this->super_BrokerBase).identifier._M_string_length;
        local_e8._0_8_ = pbStack_1d8;
        local_e8.source_id.gid = (undefined4)local_1e0;
        local_e8.source_handle.hid = local_1e0._4_4_;
        local_e8.dest_id.gid = local_1e8.gid;
        local_e8.actionTime.internalTimeCode._0_4_ = local_1e4;
        fmt.size_ = 0x11d;
        fmt.data_ = (char *)0x27;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_e8;
        ::fmt::v11::vformat_abi_cxx11_
                  (&local_1d0,(v11 *)"registering federate {}({}) on route {}",fmt,args);
        local_1b0 = local_1d0._M_string_length;
        pcStack_1a8 = local_1d0._M_dataplus._M_p;
        message._M_str = local_1d0._M_dataplus._M_p;
        message._M_len = local_1d0._M_string_length;
        name._M_str = pcVar4;
        name._M_len = sVar5;
        BrokerBase::sendToLogger(&this->super_BrokerBase,federateID,9,name,message,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
      }
      if ((this->super_BrokerBase).enable_profiling == true) {
        ActionMessage::ActionMessage
                  (&local_e8,cmd_set_profiler_flag,
                   (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,local_1e8);
        local_e8.flags._0_1_ = (byte)local_e8.flags | 0x20;
        (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)local_1e4);
        ActionMessage::~ActionMessage(&local_e8);
      }
      if ((this->mNextTimeBarrier).internalTimeCode != 0x7fffffffffffffff) {
        ActionMessage::ActionMessage
                  (&local_e8,cmd_time_barrier,
                   (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,local_1e8);
        local_e8.actionTime.internalTimeCode = (this->mNextTimeBarrier).internalTimeCode;
        local_e8.messageID = (this->super_BrokerBase).global_broker_id_local.gid;
        (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)local_1e4);
        ActionMessage::~ActionMessage(&local_e8);
      }
      ActionMessage::~ActionMessage((ActionMessage *)local_1a0);
      return;
    }
  }
  iVar11 = 6;
LAB_00340b39:
  sendFedErrorAck(this,command,iVar11);
  return;
}

Assistant:

void CoreBroker::fedRegistration(ActionMessage&& command)
{
    if (!connectionEstablished) {
        earlyMessages.push_back(std::move(command));
        return;
    }
    const bool countable = !checkActionFlag(command, non_counting_flag);
    bool dynamicFed{false};
    if (countable && getCountableFederates() >= maxFederateCount) {
        sendFedErrorAck(command, max_federate_count_exceeded);
        return;
    }
    if (getBrokerState() < BrokerState::OPERATING) {
        if (countable && allInitReady()) {
            ActionMessage noInit(CMD_INIT_NOT_READY);
            noInit.source_id = global_broker_id_local;
            transmit(parent_route_id, noInit);
        }
    } else if (getBrokerState() == BrokerState::OPERATING) {
        const bool allowed =
            dynamicFederation || !countable || checkActionFlag(command, observer_flag);
        if (!allowed) {
            // we are initialized already
            sendFedErrorAck(command, already_init_error_code);
            return;
        }
        dynamicFed = true;
    } else {
        // we are in an ERROR_STATE and terminating
        sendFedErrorAck(command, broker_terminating);
        return;
    }
    auto fedName = command.name();
    bool newFed{true};
    if (dynamicFed && checkActionFlag(command, reentrant_flag)) {
        auto fedLoc = mFederates.find(fedName);
        if (fedLoc != mFederates.end()) {
            if (fedLoc->reentrant) {
                fedLoc->route = getRoute(command.source_id);
                fedLoc->parent = command.source_id;
                fedLoc->state = ConnectionState::CONNECTED;
                newFed = false;
            } else {
                sendFedErrorAck(command, duplicate_federate_name_error_code);
                return;
            }
        }
    }

    if (newFed) {
        // this checks for duplicate federate names
        if (mFederates.find(fedName) != mFederates.end()) {
            sendFedErrorAck(command, duplicate_federate_name_error_code);
            return;
        }
        mFederates.insert(fedName, no_search, fedName);
        mFederates.back().route = getRoute(command.source_id);
        mFederates.back().parent = command.source_id;
        if (checkActionFlag(command, non_counting_flag)) {
            mFederates.back().nonCounting = true;
        }
        if (checkActionFlag(command, observer_flag)) {
            mFederates.back().observer = true;
        }
        if (checkActionFlag(command, reentrant_flag)) {
            mFederates.back().reentrant = true;
        }
        mFederates.back().dynamic = dynamicFed;
        auto lookupIndex = mFederates.size() - 1;
        if (checkActionFlag(command, child_flag)) {
            mFederates.back().global_id = GlobalFederateId(command.getExtraData());
            if (!mFederates.addSearchTermForIndex(mFederates.back().global_id, lookupIndex)) {
                sendFedErrorAck(command, duplicate_federate_id);
                return;
            }
        } else if (isRootc) {
            if (command.counter > 0 && command.counter <= 16) {
                mFederates.back().global_id = GlobalFederateId(
                    static_cast<GlobalFederateId::BaseType>(lookupIndex) + gGlobalFederateIdShift +
                    command.counter * gGlobalPriorityBlockSize);
            } else {
                mFederates.back().global_id = GlobalFederateId(
                    static_cast<GlobalFederateId::BaseType>(lookupIndex) + gGlobalFederateIdShift);
            }
            mFederates.addSearchTermForIndex(mFederates.back().global_id, lookupIndex);
        }
    }

    if (!isRootc) {
        if (global_broker_id_local.isValid()) {
            command.source_id = global_broker_id_local;
            transmit(parent_route_id, command);
        } else {
            // delay the response if we are not fully registered yet
            delayTransmitQueue.push(command);
        }
    } else {
        auto route_id = (newFed) ? mFederates.back().route : mFederates.find(fedName)->route;
        auto global_fedid =
            (newFed) ? mFederates.back().global_id : mFederates.find(fedName)->global_id;
        auto res = routing_table.emplace(global_fedid, route_id);
        if (!res.second && !newFed) {
            res.first->second = route_id;
        }

        // don't bother with the federate_table
        // transmit the response
        ActionMessage fedReply(CMD_FED_ACK);
        fedReply.source_id = global_broker_id_local;
        fedReply.dest_id = global_fedid;
        fedReply.name(fedName);
        if (checkActionFlag(command, child_flag)) {
            setActionFlag(fedReply, child_flag);
        }
        if (globalTime || asyncTime) {
            setActionFlag(fedReply, global_timing_flag);
            if (asyncTime) {
                setActionFlag(fedReply, async_timing_flag);
            }
            if (!checkActionFlag(command, non_counting_flag)) {
                timeCoord->addDependency(global_fedid);
                timeCoord->addDependent(global_fedid);
                timeCoord->setAsChild(global_fedid);
            }
        }
        if (globalDisconnect) {
            setActionFlag(fedReply, global_disconnect_flag);
        }
        transmit(route_id, fedReply);
        LOG_CONNECTIONS(global_broker_id_local,
                        getIdentifier(),
                        fmt::format("registering federate {}({}) on route {}",
                                    fedName,
                                    global_fedid.baseValue(),
                                    route_id.baseValue()));
        if (enable_profiling) {
            ActionMessage fedEnableProfiling(CMD_SET_PROFILER_FLAG,
                                             global_broker_id_local,
                                             global_fedid);
            setActionFlag(fedEnableProfiling, indicator_flag);
            transmit(route_id, fedEnableProfiling);
        }
        if (mNextTimeBarrier < Time::maxVal()) {
            ActionMessage timeBarrier(CMD_TIME_BARRIER, global_broker_id_local, global_fedid);
            timeBarrier.actionTime = mNextTimeBarrier;
            timeBarrier.messageID = global_broker_id_local.baseValue();
            transmit(route_id, timeBarrier);
        }
    }
}